

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_cb_thrdpool.c
# Opt level: O2

void uo_cb_thrdpool_quit(void)

{
  uo_cb *cb;
  size_t i;
  ulong uVar1;
  long lVar2;
  
  is_quitting = 1;
  uo_cb_thrd_init();
  sem_post((sem_t *)&thrdpool.update_sem);
  pthread_join(thrdpool.manager_thrd,(void **)0x0);
  for (uVar1 = 0; uVar1 < thrdpool.thrd_count; uVar1 = uVar1 + 1) {
    cb = uo_cb_create();
    uo_cb_invoke_async(cb);
  }
  for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 0x10) {
    if (*(int *)((long)&thrdpool.cb_thrds[0].state + lVar2) != 0) {
      pthread_join(*(pthread_t *)((long)&thrdpool.cb_thrds[0].thrd + lVar2),(void **)0x0);
    }
  }
  sem_destroy((sem_t *)&thrdpool.update_sem);
  uo_cb_thrd_quit();
  is_init = false;
  return;
}

Assistant:

static void uo_cb_thrdpool_quit(void)
{
    is_quitting = true;

    uo_cb_thrd_init();
    sem_post(&thrdpool.update_sem);

    pthread_join(thrdpool.manager_thrd, NULL);

    for (size_t i = 0; i < thrdpool.thrd_count; ++i)
        uo_cb_invoke_async(uo_cb_create());

    for (size_t i = 0; i < UO_CB_THRD_COUNT_MAX; ++i)
        if (thrdpool.cb_thrds[i].state)
            pthread_join(thrdpool.cb_thrds[i].thrd, NULL);

    sem_destroy(&thrdpool.update_sem);
    uo_cb_thrd_quit();

    is_init = false;
}